

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-builder.cpp
# Opt level: O0

void __thiscall
TypeTest_TypeBuilderGrowth_Test::~TypeTest_TypeBuilderGrowth_Test
          (TypeTest_TypeBuilderGrowth_Test *this)

{
  TypeTest_TypeBuilderGrowth_Test *this_local;
  
  ~TypeTest_TypeBuilderGrowth_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F(TypeTest, TypeBuilderGrowth) {
  TypeBuilder builder;
  EXPECT_EQ(builder.size(), 0u);
  builder.grow(3);
  EXPECT_EQ(builder.size(), 3u);
  builder.grow(0);
  EXPECT_EQ(builder.size(), 3u);
}